

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O2

int dowield(obj *wep)

{
  obj *obj;
  boolean bVar1;
  int iVar2;
  char *line;
  
  multi = 0;
  if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
    if (wep == &zeroobj || wep == (obj *)0x0) {
      if ((wep == (obj *)0x0) &&
         (wep = getobj("\x14\x15\x02\x06","wield",(obj **)0x0), wep == (obj *)0x0)) {
        return 0;
      }
    }
    else {
      bVar1 = validate_object(wep,"\x14\x15\x02\x06","wield");
      if (bVar1 == '\0') {
        return 0;
      }
    }
    if (wep == uwep) {
      pline("You are already wielding that!");
      if (wep->oclass != '\x06') {
        return 0;
      }
      if (objects[wep->otyp].oc_subtyp != '\0') {
        unweapon = '\0';
        return 0;
      }
      return 0;
    }
    iVar2 = welded(uwep);
    if (iVar2 != 0) {
      weldmsg(uwep);
      reset_remarm();
      return 0;
    }
    if (wep == &zeroobj) {
      wep = (obj *)0x0;
    }
    else {
      if (wep == uswapwep) {
        doswapweapon();
        return 0;
      }
      if (wep == uquiver) {
        setuqwep((obj *)0x0);
      }
      else if ((wep->owornmask & 0x1f007fU) != 0) {
        line = "You cannot wield that!";
        goto LAB_00271d70;
      }
    }
    obj = uwep;
    iVar2 = ready_weapon(wep);
    if (((flags.pushweapon != '\0') && (obj != (obj *)0x0)) && (uwep != obj)) {
      setuswapwep(obj);
    }
    untwoweapon();
    return iVar2;
  }
  line = "Don\'t be ridiculous!";
LAB_00271d70:
  pline(line);
  return 0;
}

Assistant:

int dowield(struct obj *wep)
{
	struct obj *oldwep;
	int result;

	/* May we attempt this? */
	multi = 0;
	if (cantwield(youmonst.data)) {
		pline("Don't be ridiculous!");
		return 0;
	}

	/* Prompt for a new weapon */
	if (wep && wep != &zeroobj && !validate_object(wep, wield_objs, "wield"))
		return 0;
	else if (!wep)
		wep = getobj(wield_objs, "wield", NULL);
	if (!wep)
		/* Cancelled */
		return 0;
	else if (wep == uwep) {
	    pline("You are already wielding that!");
	    if (is_weptool(wep)) unweapon = FALSE;	/* [see setuwep()] */
		return 0;
	} else if (welded(uwep)) {
		weldmsg(uwep);
		/* previously interrupted armor removal mustn't be resumed */
		reset_remarm();
		return 0;
	}

	/* Handle no object, or object in other slot */
	if (wep == &zeroobj)
		wep = NULL;
	else if (wep == uswapwep)
		return doswapweapon();
	else if (wep == uquiver)
		setuqwep(NULL);
	else if (wep->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL
			| W_SADDLE)) {
		pline("You cannot wield that!");
		return 0;
	}

	/* Set your new primary weapon */
	oldwep = uwep;
	result = ready_weapon(wep);
	if (flags.pushweapon && oldwep && uwep != oldwep)
		setuswapwep(oldwep);
	untwoweapon();

	return result;
}